

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O3

void __thiscall QUrl::detach(QUrl *this)

{
  QUrlPrivate *this_00;
  QUrlPrivate *pQVar1;
  
  pQVar1 = this->d;
  if (pQVar1 == (QUrlPrivate *)0x0) {
    pQVar1 = (QUrlPrivate *)operator_new(0xc0);
    pQVar1->ref = (QAtomicInteger<int>)0x1;
    pQVar1->port = -1;
    memset(&pQVar1->scheme,0,0xb2);
    this->d = pQVar1;
  }
  else if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i != 1) {
    this_00 = (QUrlPrivate *)operator_new(0xc0);
    QUrlPrivate::QUrlPrivate(this_00,pQVar1);
    this->d = this_00;
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      QUrlPrivate::~QUrlPrivate(pQVar1);
      operator_delete(pQVar1,0xc0);
      return;
    }
  }
  return;
}

Assistant:

void QUrl::detach()
{
    if (!d)
        d = new QUrlPrivate;
    else
        qAtomicDetach(d);
}